

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O1

void generate_bitstream(TrackData *trackdata)

{
  bool bVar1;
  exception *this;
  
  bVar1 = TrackData::has_track(trackdata);
  if (!bVar1) {
    __assert_fail("trackdata.has_track()",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/BitstreamEncoder.cpp"
                  ,0x74,"void generate_bitstream(TrackData &)");
  }
  if (opt.nospecial == 0) {
    bVar1 = generate_special(trackdata);
    if (bVar1) {
      bVar1 = TrackData::has_bitstream(trackdata);
      if (bVar1) {
        return;
      }
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[42],CylHead&>
                (this,(char (*) [42])"no suitable bitstream representation for ",&trackdata->cylhead
                );
      goto LAB_00142975;
    }
  }
  if (opt.nottb == 0) {
    generate_simple(trackdata);
    return;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[49],CylHead&>
            (this,(char (*) [49])"track to bitstream conversion not permitted for ",
             &trackdata->cylhead);
LAB_00142975:
  __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void generate_bitstream(TrackData& trackdata)
{
    assert(trackdata.has_track());

    // Special formats have special conversions (unless disabled)
    if (!opt.nospecial && generate_special(trackdata))
    {
        // Fail if we've encountered a flux-only special format, as converting
        // it to bitstream is unlikely to give a working track.
        if (!trackdata.has_bitstream())
            throw util::exception("no suitable bitstream representation for ", trackdata.cylhead);
    }
    else if (opt.nottb)
        throw util::exception("track to bitstream conversion not permitted for ", trackdata.cylhead);
    else if (!generate_simple(trackdata))
        throw util::exception("bitstream conversion not yet implemented for ", trackdata.cylhead);
}